

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scroller.cpp
# Opt level: O3

bool __thiscall QtMWidgets::Scroller::eventFilter(Scroller *this,QObject *obj,QEvent *event)

{
  int *piVar1;
  short sVar2;
  ScrollerPrivate *pSVar3;
  QVariantAnimation *pQVar4;
  undefined1 uVar5;
  QPoint QVar6;
  long lVar7;
  QPoint QVar8;
  uint uVar9;
  QMouseEvent *e;
  ulong uVar10;
  uint uVar11;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  double dVar15;
  double dVar16;
  undefined1 auVar17 [16];
  QPoint local_60;
  QVariant local_58;
  uint local_38;
  uint uStack_34;
  undefined8 uStack_30;
  
  pSVar3 = (this->d).d;
  if (pSVar3->target == obj) {
    sVar2 = *(short *)(event + 8);
    if (sVar2 == 5) {
      if (pSVar3->mousePressed == true) {
        lVar7 = QElapsedTimer::elapsed();
        auVar17 = QEventPoint::position();
        pSVar3 = (this->d).d;
        QVar8 = pSVar3->pos;
        local_38 = (int)((double)((ulong)auVar17._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
                        auVar17._0_8_) - QVar8.xp;
        uStack_34 = (int)((double)((ulong)auVar17._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
                         auVar17._8_8_) - QVar8.yp;
        uStack_30 = 0;
        uVar11 = ((uStack_34 ^ (int)uStack_34 >> 0x1f) - ((int)uStack_34 >> 0x1f)) +
                 ((local_38 ^ (int)local_38 >> 0x1f) - ((int)local_38 >> 0x1f));
        piVar1 = &pSVar3->distance;
        *piVar1 = *piVar1 + uVar11;
        auVar17 = QEventPoint::position();
        QVar8.xp = (int)((double)((ulong)auVar17._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
                        auVar17._0_8_);
        QVar8.yp = (int)((double)((ulong)auVar17._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
                        auVar17._8_8_);
        ((this->d).d)->pos = QVar8;
        if (5 < uVar11) {
          auVar17._0_8_ = (double)lVar7 / 1000.0;
          auVar13._0_8_ = (double)(int)local_38;
          auVar13._8_8_ = (double)(int)uStack_34;
          pSVar3 = (this->d).d;
          auVar17._8_8_ = auVar17._0_8_;
          auVar17 = divpd(auVar13,auVar17);
          pSVar3->xVelocity = (qreal)auVar17._0_8_;
          pSVar3->yVelocity = (qreal)auVar17._8_8_;
          QElapsedTimer::restart();
        }
      }
    }
    else if (sVar2 == 3) {
      lVar7 = QElapsedTimer::elapsed();
      pSVar3 = (this->d).d;
      if (lVar7 <= pSVar3->maxPause) {
        uVar11 = pSVar3->distance;
        uVar9 = -uVar11;
        if (0 < (int)uVar11) {
          uVar9 = uVar11;
        }
        if (pSVar3->startDragDistance <= uVar9) {
          dVar16 = pSVar3->xVelocity;
          uVar10 = -(ulong)(dVar16 < -dVar16);
          dVar15 = (double)(~uVar10 & (ulong)dVar16 | (ulong)-dVar16 & uVar10);
          if (((double)pSVar3->minVelocity <= dVar15) ||
             (dVar12 = pSVar3->yVelocity, uVar10 = -(ulong)(dVar12 < -dVar12),
             (double)pSVar3->minVelocity <=
             (double)(~uVar10 & (ulong)dVar12 | (ulong)-dVar12 & uVar10))) {
            if (pSVar3->maxVelocity == 0) {
              dVar15 = pSVar3->yVelocity;
            }
            else {
              dVar12 = (double)pSVar3->maxVelocity;
              if (dVar12 < dVar15) {
                dVar16 = (double)(~-(ulong)(0.0 < dVar16) & (ulong)-dVar12 |
                                 -(ulong)(0.0 < dVar16) & (ulong)dVar12);
                pSVar3->xVelocity = dVar16;
              }
              dVar15 = pSVar3->yVelocity;
              uVar10 = -(ulong)(dVar15 < -dVar15);
              if (dVar12 < (double)(~uVar10 & (ulong)dVar15 | (ulong)-dVar15 & uVar10)) {
                if (dVar15 <= 0.0) {
                  dVar15 = -dVar12;
                  pSVar3->yVelocity = dVar15;
                }
                else {
                  pSVar3->yVelocity = dVar12;
                  dVar15 = dVar12;
                }
              }
            }
            auVar14._0_8_ = (double)pSVar3->scrollTime * dVar16;
            auVar14._8_8_ = (double)pSVar3->scrollTime * dVar15;
            auVar17 = divpd(auVar14,_DAT_00186e70);
            local_60.xp = (int)((double)((ulong)auVar17._0_8_ & 0x8000000000000000 |
                                        0x3fe0000000000000) + auVar17._0_8_) + (pSVar3->pos).xp;
            local_60.yp = (int)((double)((ulong)auVar17._8_8_ & 0x8000000000000000 |
                                        0x3fe0000000000000) + auVar17._8_8_) + (pSVar3->pos).yp;
            pQVar4 = pSVar3->scrollAnimation;
            QVariant::QVariant(&local_58,&pSVar3->pos);
            QVariantAnimation::setStartValue((QVariant *)pQVar4);
            QVariant::~QVariant(&local_58);
            pQVar4 = ((this->d).d)->scrollAnimation;
            QVariant::QVariant(&local_58,&local_60);
            QVariantAnimation::setEndValue((QVariant *)pQVar4);
            QVariant::~QVariant(&local_58);
            aboutToStart(this);
            QAbstractAnimation::start(((this->d).d)->scrollAnimation,0);
          }
        }
      }
      QElapsedTimer::invalidate();
      ((this->d).d)->mousePressed = false;
    }
    else if (sVar2 == 2) {
      auVar17 = QEventPoint::position();
      QVar6.xp = (int)((double)((ulong)auVar17._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
                      auVar17._0_8_);
      QVar6.yp = (int)((double)((ulong)auVar17._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
                      auVar17._8_8_);
      ((this->d).d)->pos = QVar6;
      pSVar3 = (this->d).d;
      pSVar3->mousePressed = true;
      pSVar3->distance = 0;
      pSVar3->xVelocity = 0.0;
      pSVar3->yVelocity = 0.0;
      QAbstractAnimation::stop();
      QElapsedTimer::start();
    }
    return false;
  }
  uVar5 = QObject::eventFilter(&this->super_QObject,(QEvent *)obj);
  return (bool)uVar5;
}

Assistant:

bool
Scroller::eventFilter( QObject * obj, QEvent * event )
{
	if( obj == d->target )
	{
		if( event->type() == QEvent::MouseButtonPress )
		{
			QMouseEvent * e = static_cast< QMouseEvent* > ( event );

			d->pos = e->pos();
			d->mousePressed = true;
			d->xVelocity = 0.0;
			d->yVelocity = 0.0;
			d->distance = 0;

			d->scrollAnimation->stop();

			d->elapsed.start();
		}
		else if( event->type() == QEvent::MouseButtonRelease )
		{
			if( d->elapsed.elapsed() <= d->maxPause &&
				(uint) qAbs( d->distance ) >= d->startDragDistance )
			{
				if( qAbs( d->xVelocity ) >= d->minVelocity ||
					qAbs( d->yVelocity ) >= d->minVelocity )
				{
					if( d->maxVelocity > 0 )
					{
						if( qAbs( d->xVelocity ) > d->maxVelocity )
						{
							if( d->xVelocity > 0 )
								d->xVelocity = (qreal) d->maxVelocity;
							else
								d->xVelocity = - (qreal) d->maxVelocity;
						}

						if( qAbs( d->yVelocity ) > d->maxVelocity )
						{
							if( d->yVelocity > 0 )
								d->yVelocity = (qreal) d->maxVelocity;
							else
								d->yVelocity = - (qreal) d->maxVelocity;
						}
					}

					const QPoint newPos = QPoint(
						d->pos.x() + qRound( d->xVelocity * d->scrollTime / 1000 ),
						d->pos.y() + qRound( d->yVelocity * d->scrollTime / 1000 ) );

					d->scrollAnimation->setStartValue( d->pos );
					d->scrollAnimation->setEndValue( newPos );

					emit aboutToStart();

					d->scrollAnimation->start();
				}
			}

			d->elapsed.invalidate();
			d->mousePressed = false;
		}
		else if( event->type() == QEvent::MouseMove )
		{
			if( d->mousePressed )
			{
				QMouseEvent * e = static_cast< QMouseEvent* > ( event );

				const qreal time = (qreal) d->elapsed.elapsed() / 1000.0;

				const QPoint p = e->pos() - d->pos;

				d->distance += p.manhattanLength();

				d->pos = e->pos();

				if( p.manhattanLength() > 5 )
				{
					d->xVelocity = (qreal) p.x() / time;
					d->yVelocity = (qreal) p.y() / time;

					d->elapsed.restart();
				}
			}
		}

		return false;
	}
	else
		return QObject::eventFilter( obj, event );
}